

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpre.c
# Opt level: O2

ssize_t mpt_qpre(mpt_queue *queue,size_t len)

{
  ulong uVar1;
  size_t sVar2;
  size_t high;
  size_t low;
  
  mpt_queue_empty(queue,&low,&high);
  if (low + high < len) {
    uVar1 = 0xffffffffffffffef;
  }
  else {
    sVar2 = high - len;
    if ((high < len && high != 0) || (sVar2 = queue->off - len, queue->off < len || sVar2 == 0)) {
      sVar2 = sVar2 + queue->max;
    }
    queue->off = sVar2;
    queue->len = queue->len + len;
    uVar1 = ((low + high) - len) / len;
  }
  return uVar1;
}

Assistant:

extern ssize_t mpt_qpre(MPT_STRUCT(queue) *queue, size_t len)
{
	size_t low, high, total;
	
	mpt_queue_empty(queue, &low, &high);
	total = low + high;
	
	/* not enough remaining space */
	if (len > total) {
		return MPT_ERROR(MissingBuffer);
	}
	/* data element wraps around upper border */
	if (high && high < len) {
		queue->off = queue->max - (len - high);
	}
	else {
		if (len < queue->off) queue->off -= len;
		else queue->off += queue->max - len;
	}
	total -= len;
	queue->len += len;
	
	return total / len;
}